

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  u64 n;
  int iVar1;
  int iVar2;
  undefined8 *pOld;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  void *__s;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  iVar7 = *(int *)((long)pContext + 0x10);
  if (iVar7 != 0) goto LAB_001e26a8;
  pOld = *pContext;
  iVar6 = 0x8000;
  if (nToken < 0x8000) {
    iVar6 = nToken;
  }
  if (pOld == (undefined8 *)0x0) {
    iVar2 = sqlite3_initialize();
    iVar7 = 7;
    if ((iVar2 == 0) && (pOld = (undefined8 *)sqlite3Malloc(0x188), pOld != (undefined8 *)0x0)) {
      pOld[6] = 0;
      pOld[7] = 0;
      pOld[4] = 0;
      pOld[5] = 0;
      pOld[2] = 0;
      pOld[3] = 0;
      *pOld = 0;
      pOld[1] = 0;
      pOld[8] = 0;
      iVar2 = 0;
LAB_001e2589:
      *(undefined8 **)pContext = pOld;
      *(int *)(pOld + 3) = iVar2;
LAB_001e2590:
      *(int *)(pOld + 3) = iVar2 + 1;
      lVar3 = (long)iVar2;
      pOld[lVar3 * 5 + 6] = 0;
      (pOld + lVar3 * 5 + 6)[1] = 0;
      pOld[lVar3 * 5 + 4] = 0;
      (pOld + lVar3 * 5 + 4)[1] = 0;
      pOld[lVar3 * 5 + 8] = 0;
      pcVar4 = sqlite3Fts5Strndup(&local_3c,pToken,iVar6);
      pOld[lVar3 * 5 + 5] = pcVar4;
      *(int *)(pOld + lVar3 * 5 + 6) = iVar6;
      *(int *)((long)pOld + lVar3 * 0x28 + 0x34) = iVar6;
      iVar7 = local_3c;
      if (local_3c == 0 && *(int *)(*(long *)((long)pContext + 8) + 0x6c) != 0) {
        sVar5 = strlen(pcVar4);
        *(int *)(pOld + lVar3 * 5 + 6) = (int)sVar5;
        iVar7 = local_3c;
      }
    }
  }
  else {
    iVar2 = *(int *)(pOld + 3);
    uVar8 = (ulong)iVar2;
    if ((tflags & 1U) == 0 || (long)uVar8 < 1) {
      if ((uVar8 & 7) != 0) goto LAB_001e2590;
      iVar1 = sqlite3_initialize();
      iVar7 = 7;
      if ((iVar1 == 0) &&
         (pOld = (undefined8 *)sqlite3Realloc(pOld,uVar8 * 0x28 + 0x188), pOld != (undefined8 *)0x0)
         ) goto LAB_001e2589;
    }
    else {
      iVar2 = sqlite3_initialize();
      iVar7 = 7;
      if (iVar2 == 0) {
        n = (long)iVar6 + 0x39;
        __s = sqlite3Malloc(n);
        if (__s != (void *)0x0) {
          iVar7 = 0;
          memset(__s,0,n);
          pcVar4 = (char *)((long)__s + 0x38);
          *(char **)((long)__s + 8) = pcVar4;
          *(int *)((long)__s + 0x10) = iVar6;
          *(int *)((long)__s + 0x14) = iVar6;
          if (*(int *)(*(long *)((long)pContext + 8) + 0x6c) != 0) {
            sVar5 = strlen(pcVar4);
            *(int *)((long)__s + 0x10) = (int)sVar5;
          }
          memcpy(pcVar4,pToken,(long)iVar6);
          iVar6 = *(int *)(pOld + 3);
          *(undefined8 *)((long)__s + 0x20) = pOld[(long)iVar6 * 5 + 3];
          pOld[(long)iVar6 * 5 + 3] = __s;
        }
      }
    }
  }
  *(int *)((long)pContext + 0x10) = iVar7;
LAB_001e26a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->pTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      pSyn->nFullTerm = pSyn->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata ){
        pSyn->nQueryTerm = (int)strlen(pSyn->pTerm);
      }
      memcpy(pSyn->pTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase,
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->pTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
      pTerm->nFullTerm = pTerm->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata && rc==SQLITE_OK ){
        pTerm->nQueryTerm = (int)strlen(pTerm->pTerm);
      }
    }
  }

  pCtx->rc = rc;
  return rc;
}